

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O2

int StopThreadHokuyox(HOKUYO *pHokuyo)

{
  CRITICAL_SECTION *__mutex;
  long lVar1;
  
  __mutex = HokuyoCS;
  lVar1 = 0;
  do {
    if (*(HOKUYO **)((long)addrsHokuyo + lVar1 * 2) == pHokuyo) {
      *(undefined4 *)((long)bExitHokuyo + lVar1) = 1;
      WaitForThread(*(THREAD_IDENTIFIER *)((long)HokuyoThreadId + lVar1 * 2));
      pthread_mutex_destroy((pthread_mutex_t *)__mutex);
      *(undefined4 *)((long)resHokuyo + lVar1) = 1;
      return 0;
    }
    lVar1 = lVar1 + 4;
    __mutex = __mutex + 1;
  } while (lVar1 != 0x40);
  return 1;
}

Assistant:

HARDWAREX_API int StopThreadHokuyox(HOKUYO* pHokuyo)
{
	int id = 0;

	while (addrsHokuyo[id] != pHokuyo)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	bExitHokuyo[id] = TRUE;
	WaitForThread(HokuyoThreadId[id]);
	DeleteCriticalSection(&HokuyoCS[id]);
	resHokuyo[id] = EXIT_FAILURE;
	return EXIT_SUCCESS;
}